

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetColumnWidth(int column_n,float width)

{
  ImGuiTable *table_00;
  ImGuiTableColumn *pIVar1;
  ImGuiTableColumn *pIVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  ImGuiTableColumn *local_60;
  ImGuiTableColumn *local_58;
  ImGuiTableColumn *pIStack_40;
  float column_1_width;
  ImGuiTableColumn *column_1;
  float max_width;
  float min_width;
  float column_0_width;
  ImGuiTableColumn *column_0;
  ImGuiTable *table;
  ImGuiContext *g;
  float width_local;
  int column_n_local;
  
  table_00 = GImGui->CurrentTable;
  bVar3 = false;
  if (table_00 != (ImGuiTable *)0x0) {
    bVar3 = (table_00->IsLayoutLocked & 1U) == 0;
  }
  if (!bVar3) {
    __assert_fail("table != __null && table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x80c,"void ImGui::TableSetColumnWidth(int, float)");
  }
  bVar3 = false;
  if (-1 < column_n) {
    bVar3 = column_n < table_00->ColumnsCount;
  }
  if (!bVar3) {
    __assert_fail("column_n >= 0 && column_n < table->ColumnsCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x80d,"void ImGui::TableSetColumnWidth(int, float)");
  }
  pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table_00->Columns,column_n);
  if (table_00->MinColumnWidth <= 0.0) {
    __assert_fail("table->MinColumnWidth > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x813,"void ImGui::TableSetColumnWidth(int, float)");
  }
  fVar5 = table_00->MinColumnWidth;
  fVar4 = TableGetMaxColumnWidth(table_00,column_n);
  fVar4 = ImMax<float>(fVar5,fVar4);
  fVar4 = ImClamp<float>(width,fVar5,fVar4);
  if (((pIVar1->WidthGiven != fVar4) || (NAN(pIVar1->WidthGiven) || NAN(fVar4))) &&
     ((pIVar1->WidthRequest != fVar4 || (NAN(pIVar1->WidthRequest) || NAN(fVar4))))) {
    if (pIVar1->NextEnabledColumn == -1) {
      local_58 = (ImGuiTableColumn *)0x0;
    }
    else {
      local_58 = ImSpan<ImGuiTableColumn>::operator[]
                           (&table_00->Columns,(int)pIVar1->NextEnabledColumn);
    }
    pIStack_40 = local_58;
    if (((pIVar1->Flags & 8U) == 0) ||
       (((local_58 != (ImGuiTableColumn *)0x0 && (table_00->LeftMostStretchedColumn != -1)) &&
        (pIVar2 = ImSpan<ImGuiTableColumn>::operator[]
                            (&table_00->Columns,(int)table_00->LeftMostStretchedColumn),
        pIVar2->DisplayOrder < pIVar1->DisplayOrder)))) {
      if (local_58 == (ImGuiTableColumn *)0x0) {
        if (pIVar1->PrevEnabledColumn == -1) {
          local_60 = (ImGuiTableColumn *)0x0;
        }
        else {
          local_60 = ImSpan<ImGuiTableColumn>::operator[]
                               (&table_00->Columns,(int)pIVar1->PrevEnabledColumn);
        }
        pIStack_40 = local_60;
      }
      if (pIStack_40 != (ImGuiTableColumn *)0x0) {
        fVar5 = ImMax<float>(pIStack_40->WidthRequest - (fVar4 - pIVar1->WidthRequest),fVar5);
        fVar4 = (pIVar1->WidthRequest + pIStack_40->WidthRequest) - fVar5;
        if (fVar4 <= 0.0 || fVar5 <= 0.0) {
          __assert_fail("column_0_width > 0.0f && column_1_width > 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                        ,0x851,"void ImGui::TableSetColumnWidth(int, float)");
        }
        pIVar1->WidthRequest = fVar4;
        pIStack_40->WidthRequest = fVar5;
        if (((pIVar1->Flags | pIStack_40->Flags) & 4U) != 0) {
          TableUpdateColumnsWeightFromWidth(table_00);
        }
        table_00->IsSettingsDirty = true;
      }
    }
    else {
      pIVar1->WidthRequest = fVar4;
      table_00->IsSettingsDirty = true;
    }
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidth(int column_n, float width)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && table->IsLayoutLocked == false);
    IM_ASSERT(column_n >= 0 && column_n < table->ColumnsCount);
    ImGuiTableColumn* column_0 = &table->Columns[column_n];
    float column_0_width = width;

    // Apply constraints early
    // Compare both requested and actual given width to avoid overwriting requested width when column is stuck (minimum size, bounded)
    IM_ASSERT(table->MinColumnWidth > 0.0f);
    const float min_width = table->MinColumnWidth;
    const float max_width = ImMax(min_width, TableGetMaxColumnWidth(table, column_n));
    column_0_width = ImClamp(column_0_width, min_width, max_width);
    if (column_0->WidthGiven == column_0_width || column_0->WidthRequest == column_0_width)
        return;

    //IMGUI_DEBUG_LOG("TableSetColumnWidth(%d, %.1f->%.1f)\n", column_0_idx, column_0->WidthGiven, column_0_width);
    ImGuiTableColumn* column_1 = (column_0->NextEnabledColumn != -1) ? &table->Columns[column_0->NextEnabledColumn] : NULL;

    // In this surprisingly not simple because of how we support mixing Fixed and multiple Stretch columns.
    // - All fixed: easy.
    // - All stretch: easy.
    // - One or more fixed + one stretch: easy.
    // - One or more fixed + more than one stretch: tricky.
    // Qt when manual resize is enabled only support a single _trailing_ stretch column.

    // When forwarding resize from Wn| to Fn+1| we need to be considerate of the _NoResize flag on Fn+1.
    // FIXME-TABLE: Find a way to rewrite all of this so interactions feel more consistent for the user.
    // Scenarios:
    // - F1 F2 F3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. Subsequent columns will be offset.
    // - F1 F2 F3  resize from F3|          --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered.
    // - F1 F2 W3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered, but it doesn't make much sense as the Stretch column will always be minimal size.
    // - F1 F2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 W3  resize from W1| or W2|   --> ok
    // - W1 W2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2 F3  resize from F3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2     resize from F2|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 F3  resize from W1| or W2|   --> ok
    // - W1 F2 W3  resize from W1| or F2|   --> ok
    // - F1 W2 F3  resize from W2|          --> ok
    // - F1 W3 F2  resize from W3|          --> ok
    // - W1 F2 F3  resize from W1|          --> ok: equivalent to resizing |F2. F3 will not move.
    // - W1 F2 F3  resize from F2|          --> ok
    // All resizes from a Wx columns are locking other columns.

    // Possible improvements:
    // - W1 W2 W3  resize W1|               --> to not be stuck, both W2 and W3 would stretch down. Seems possible to fix. Would be most beneficial to simplify resize of all-weighted columns.
    // - W3 F1 F2  resize W3|               --> to not be stuck past F1|, both F1 and F2 would need to stretch down, which would be lossy or ambiguous. Seems hard to fix.

    // [Resize Rule 1] Can't resize from right of right-most visible column if there is any Stretch column. Implemented in TableUpdateLayout().

    // If we have all Fixed columns OR resizing a Fixed column that doesn't come after a Stretch one, we can do an offsetting resize.
    // This is the preferred resize path
    if (column_0->Flags & ImGuiTableColumnFlags_WidthFixed)
        if (!column_1 || table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder >= column_0->DisplayOrder)
        {
            column_0->WidthRequest = column_0_width;
            table->IsSettingsDirty = true;
            return;
        }

    // We can also use previous column if there's no next one (this is used when doing an auto-fit on the right-most stretch column)
    if (column_1 == NULL)
        column_1 = (column_0->PrevEnabledColumn != -1) ? &table->Columns[column_0->PrevEnabledColumn] : NULL;
    if (column_1 == NULL)
        return;

    // Resizing from right-side of a Stretch column before a Fixed column forward sizing to left-side of fixed column.
    // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
    float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
    column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
    IM_ASSERT(column_0_width > 0.0f && column_1_width > 0.0f);
    column_0->WidthRequest = column_0_width;
    column_1->WidthRequest = column_1_width;
    if ((column_0->Flags | column_1->Flags) & ImGuiTableColumnFlags_WidthStretch)
        TableUpdateColumnsWeightFromWidth(table);
    table->IsSettingsDirty = true;
}